

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  int cell_edge;
  int iVar3;
  int iVar4;
  
  iVar4 = 1;
  iVar3 = 0;
  for (cell_edge = 0; cell_edge < ref_cell->edge_per; cell_edge = cell_edge + 1) {
    pRVar1 = ref_subdiv->mark;
    RVar2 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,cell);
    iVar3 = iVar3 + pRVar1[RVar2] * iVar4;
    iVar4 = iVar4 * 2;
  }
  return iVar3;
}

Assistant:

static REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv, REF_CELL ref_cell,
                              REF_INT cell) {
  REF_INT edge, map, bit;

  map = 0;
  bit = 1;
  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    map +=
        bit * ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell));
    bit *= 2;
  }

  return map;
}